

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseJsonName
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  ErrorMaker local_b8;
  undefined1 local_a8 [8];
  LocationRecorder value_location;
  string_view local_78 [2];
  undefined1 local_58 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *field_location_local;
  FieldDescriptorProto *field_local;
  Parser *this_local;
  
  bVar1 = FieldDescriptorProto::has_json_name(field);
  if (bVar1) {
    ErrorMaker::ErrorMaker((ErrorMaker *)&location.location_,"Already set option \"json_name\".");
    RecordError(this,stack0xffffffffffffffc0);
    FieldDescriptorProto::clear_json_name(field);
  }
  LocationRecorder::LocationRecorder((LocationRecorder *)local_58,field_location,10);
  LocationRecorder::RecordLegacyLocation
            ((LocationRecorder *)local_58,&field->super_Message,OPTION_NAME);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(local_78,"json_name");
  bVar1 = Consume(this,local_78[0]);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&value_location.location_,"=");
    bVar1 = Consume(this,stack0xffffffffffffff70);
    if (bVar1) {
      LocationRecorder::LocationRecorder((LocationRecorder *)local_a8,(LocationRecorder *)local_58);
      LocationRecorder::RecordLegacyLocation
                ((LocationRecorder *)local_a8,&field->super_Message,OPTION_VALUE);
      output = FieldDescriptorProto::mutable_json_name_abi_cxx11_(field);
      ErrorMaker::ErrorMaker(&local_b8,"Expected string for JSON name.");
      this_local._7_1_ = ConsumeString(this,output,local_b8);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_a8);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseJsonName(FieldDescriptorProto* field,
                           const LocationRecorder& field_location,
                           const FileDescriptorProto* containing_file) {
  if (field->has_json_name()) {
    RecordError("Already set option \"json_name\".");
    field->clear_json_name();
  }

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kJsonNameFieldNumber);
  location.RecordLegacyLocation(field,
                                DescriptorPool::ErrorCollector::OPTION_NAME);

  DO(Consume("json_name"));
  DO(Consume("="));

  LocationRecorder value_location(location);
  value_location.RecordLegacyLocation(
      field, DescriptorPool::ErrorCollector::OPTION_VALUE);

  DO(ConsumeString(field->mutable_json_name(),
                   "Expected string for JSON name."));
  return true;
}